

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(defV *data,char *val)

{
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  double *pdVar3;
  long *plVar4;
  complex<double> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  const_reference pvVar5;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_02;
  const_reference this_03;
  NamedPoint *pNVar6;
  const_reference pvVar7;
  int in_EDX;
  char *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  double dVar8;
  double vald;
  NamedPoint *point;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vec_1;
  vector<double,_std::allocator<double>_> *vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  undefined1 in_stack_00000070 [16];
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  char cVar9;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  value_type vVar10;
  vector<double,_std::allocator<double>_> *local_48;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ::index(in_RDI,in_RSI,in_EDX);
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    pdVar3 = std::
             get<double,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x425055);
    *in_RSI = (char)(int)*pdVar3;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
  default:
    plVar4 = std::
             get<long,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x425077);
    *in_RSI = (char)*plVar4;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::
    get<std::__cxx11::string,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x425092);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4250a1);
    if (bVar1) {
      vVar10 = '\0';
    }
    else {
      pvVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](this,CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT15(in_stack_ffffffffffffffad,
                                                            CONCAT14(in_stack_ffffffffffffffac,
                                                                     in_stack_ffffffffffffffa8)))));
      vVar10 = *pvVar7;
    }
    *in_RSI = vVar10;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    this_00 = std::
              get<std::complex<double>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x4250dd);
    dVar8 = std::complex<double>::real_abi_cxx11_(this_00);
    *in_RSI = (char)(int)dVar8;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    this_01 = std::
              get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x425101);
    bVar1 = std::vector<double,_std::allocator<double>_>::empty(local_48);
    if (bVar1) {
      cVar9 = '\0';
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0);
      cVar9 = (char)(int)*pvVar5;
    }
    *in_RSI = cVar9;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    this_02 = std::
              get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                        ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          *)0x425152);
    bVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::empty
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       local_48);
    if (bVar1) {
      cVar9 = '\0';
    }
    else {
      this_03 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                operator[](this_02,0);
      dVar8 = std::complex<double>::real_abi_cxx11_(this_03);
      cVar9 = (char)(int)dVar8;
    }
    *in_RSI = cVar9;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    pNVar6 = std::
             get<helics::NamedPoint,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)0x4251a7);
    uVar2 = std::isnan(pNVar6->value);
    if ((uVar2 & 1) == 0) {
      *in_RSI = (char)(int)pNVar6->value;
    }
    else {
      std::__cxx11::string::operator_cast_to_basic_string_view(this);
      dVar8 = getDoubleFromString((string_view)in_stack_00000070);
      if ((dVar8 != -1e+49) || (NAN(dVar8))) {
        *in_RSI = (char)(int)dVar8;
      }
      else {
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x425224);
        if (bVar1) {
          vVar10 = '\0';
        }
        else {
          pvVar7 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (this,CONCAT17(in_stack_ffffffffffffffaf,
                                            CONCAT16(in_stack_ffffffffffffffae,
                                                     CONCAT15(in_stack_ffffffffffffffad,
                                                              CONCAT14(in_stack_ffffffffffffffac,
                                                                       in_stack_ffffffffffffffa8))))
                             );
          vVar10 = *pvVar7;
        }
        *in_RSI = vVar10;
      }
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, char& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = static_cast<char>(std::get<double>(data));
            break;
        case int_loc:  // int64_t
        default:
            val = static_cast<char>(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        {
            const auto& str = std::get<std::string>(data);
            val = (str.empty()) ? '\0' : str[0];
            break;
        }
        case complex_loc:  // complex
            val = static_cast<char>(std::get<std::complex<double>>(data).real());
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val = (!vec.empty()) ? static_cast<char>(vec[0]) : '\0';
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            val = (!vec.empty()) ? static_cast<char>(vec[0].real()) : '\0';
            break;
        }
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                const double vald = getDoubleFromString(point.name);
                if (vald != invalidDouble) {
                    val = static_cast<char>(vald);
                } else {
                    val = !point.name.empty() ? point.name[0] : 0;
                }
            } else {
                val = static_cast<char>(point.value);
            }
        } break;
    }
}